

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O2

void __thiscall BayesianGameBase::BayesianGameBase(BayesianGameBase *this)

{
  _Rb_tree_header *p_Var1;
  undefined1 auVar2 [16];
  allocator_type local_9;
  
  (this->super_Interface_ProblemToPolicyDiscretePure).super_Interface_ProblemToPolicyDiscrete.
  _vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)&PTR__BayesianGameBase_005d7f80;
  std::vector<double,_std::allocator<double>_>::vector(&this->_m_jTypeProbs,0,&local_9);
  p_Var1 = &(this->_m_jTypeProbsSparse).data_.
            super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->_m_jTypeProbsSparse).size_ = 0;
  *(undefined8 *)
   &(this->_m_jTypeProbsSparse).data_.
    super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
    ._M_t._M_impl = 0;
  *(undefined8 *)
   &(this->_m_jTypeProbsSparse).data_.
    super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(_Base_ptr *)
   ((long)&(this->_m_jTypeProbsSparse).data_.
           super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  auVar2 = ZEXT416(0) << 0x40;
  *(_Rb_tree_header **)
   ((long)&(this->_m_jTypeProbsSparse).data_.
           super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->_m_jTypeProbsSparse).data_.
           super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var1;
  *(undefined1 (*) [16])
   &(this->_m_jTypeProbsSparse).data_.
    super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count = auVar2;
  *(undefined1 (*) [16])((long)&this->_m_jointToIndTypes + 1) = auVar2;
  *(undefined8 *)&this->_m_verboseness = 0;
  *(undefined8 *)((long)&this->_m_nrAgents + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrTypes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrTypes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrTypes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + 2) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrTypes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + 2) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrTypes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrTypes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)((long)&this->_m_nrJTypes + 2) = 0;
  *(undefined8 *)((long)&this->_m_nrJA + 2) = 0;
  this->_m_stepSizeActions = (size_t *)auVar2._0_8_;
  this->_m_stepSizeTypes = (size_t *)auVar2._8_8_;
  return;
}

Assistant:

BayesianGameBase::BayesianGameBase()
    : 
        _m_jTypeProbs(0)
        ,_m_jTypeProbsSparse(0)
        ,_m_verboseness(0)
{
    _m_initialized=false;
    _m_nrAgents = 0;
    _m_nrJTypes = 0;
    _m_nrJA = 0;
    _m_JAoverflow = false;
    _m_JToverflow = false;
    _m_stepSizeActions = 0;
    _m_stepSizeTypes = 0;
    _m_jointToIndTypes = 0;
    _m_jointToIndTypesMap = 0;
}